

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O1

int32_t __thiscall
icu_63::MessagePattern::parseChoiceStyle
          (MessagePattern *this,int32_t index,int32_t nestingLevel,UParseError *parseError,
          UErrorCode *errorCode)

{
  short sVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  char16_t *pcVar5;
  char16_t cVar6;
  uint uVar7;
  char16_t *pcVar8;
  uint uVar9;
  
  uVar9 = 0;
  if (U_ZERO_ERROR < *errorCode) {
    return 0;
  }
  uVar3 = skipWhiteSpace(this,index);
  sVar1 = (this->msg).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    uVar4 = (this->msg).fUnion.fFields.fLength;
  }
  else {
    uVar4 = (int)sVar1 >> 5;
  }
  if (uVar3 == uVar4) {
LAB_00292456:
    uVar9 = 0;
    setParseError(this,parseError,0);
    *errorCode = U_PATTERN_SYNTAX_ERROR;
  }
  else {
    if (uVar3 < uVar4) {
      if (((int)sVar1 & 2U) == 0) {
        pcVar5 = (this->msg).fUnion.fFields.fArray;
      }
      else {
        pcVar5 = (char16_t *)((long)&(this->msg).fUnion + 2);
      }
      if (pcVar5[(int)uVar3] == L'}') goto LAB_00292456;
    }
    pcVar5 = (char16_t *)((long)&(this->msg).fUnion + 2);
    do {
      uVar4 = skipDouble(this,uVar3);
      if (uVar4 == uVar3) goto LAB_002924bf;
      if ((int)(uVar4 - uVar3) < 0x10000) {
        parseDouble(this,uVar3,uVar4,'\x01',parseError,errorCode);
        if (U_ZERO_ERROR < *errorCode) goto LAB_002924f8;
        uVar4 = skipWhiteSpace(this,uVar4);
        sVar1 = (this->msg).fUnion.fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          uVar3 = (this->msg).fUnion.fFields.fLength;
        }
        else {
          uVar3 = (int)sVar1 >> 5;
        }
        if (uVar4 == uVar3) {
LAB_002924bf:
          setParseError(this,parseError,index);
          *errorCode = U_PATTERN_SYNTAX_ERROR;
          goto LAB_002924f8;
        }
        cVar6 = L'\xffff';
        if (uVar4 < uVar3) {
          pcVar8 = pcVar5;
          if (((int)sVar1 & 2U) == 0) {
            pcVar8 = (this->msg).fUnion.fFields.fArray;
          }
          cVar6 = pcVar8[(int)uVar4];
        }
        if (((cVar6 != L'#') && (cVar6 != L'<')) && (cVar6 != L'≤')) goto LAB_002924bf;
        addPart(this,UMSGPAT_PART_TYPE_ARG_SELECTOR,uVar4,1,0,errorCode);
        uVar4 = parseMessage(this,uVar4 + 1,0,nestingLevel + 1,UMSGPAT_ARG_TYPE_CHOICE,parseError,
                             errorCode);
        if (U_ZERO_ERROR < *errorCode) goto LAB_002924f8;
        sVar1 = (this->msg).fUnion.fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          uVar7 = (this->msg).fUnion.fFields.fLength;
        }
        else {
          uVar7 = (int)sVar1 >> 5;
        }
        uVar3 = uVar4;
        if (uVar4 == uVar7) {
LAB_002925ed:
          bVar2 = false;
          uVar9 = uVar4;
        }
        else {
          if (uVar4 < uVar7) {
            pcVar8 = pcVar5;
            if (((int)sVar1 & 2U) == 0) {
              pcVar8 = (this->msg).fUnion.fFields.fArray;
            }
            if (pcVar8[(int)uVar4] == L'}') {
              if ((0 < nestingLevel) ||
                 (uVar9 = 0,
                 ((this->partsList->super_MessagePatternList<icu_63::MessagePattern::Part,_32>).a.
                 ptr)->type == UMSGPAT_PART_TYPE_MSG_START)) goto LAB_002925ed;
              setParseError(this,parseError,index);
              *errorCode = U_PATTERN_SYNTAX_ERROR;
              bVar2 = false;
              goto LAB_002924fa;
            }
          }
          uVar3 = skipWhiteSpace(this,uVar4 + 1);
          bVar2 = true;
        }
      }
      else {
        setParseError(this,parseError,uVar3);
        *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
LAB_002924f8:
        bVar2 = false;
        uVar9 = 0;
        uVar3 = uVar4;
      }
LAB_002924fa:
    } while (bVar2);
  }
  return uVar9;
}

Assistant:

int32_t
MessagePattern::parseChoiceStyle(int32_t index, int32_t nestingLevel,
                                 UParseError *parseError, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) {
        return 0;
    }
    int32_t start=index;
    index=skipWhiteSpace(index);
    if(index==msg.length() || msg.charAt(index)==u_rightCurlyBrace) {
        setParseError(parseError, 0);  // Missing choice argument pattern.
        errorCode=U_PATTERN_SYNTAX_ERROR;
        return 0;
    }
    for(;;) {
        // The choice argument style contains |-separated (number, separator, message) triples.
        // Parse the number.
        int32_t numberIndex=index;
        index=skipDouble(index);
        int32_t length=index-numberIndex;
        if(length==0) {
            setParseError(parseError, start);  // Bad choice pattern syntax.
            errorCode=U_PATTERN_SYNTAX_ERROR;
            return 0;
        }
        if(length>Part::MAX_LENGTH) {
            setParseError(parseError, numberIndex);  // Choice number too long.
            errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
            return 0;
        }
        parseDouble(numberIndex, index, TRUE, parseError, errorCode);  // adds ARG_INT or ARG_DOUBLE
        if(U_FAILURE(errorCode)) {
            return 0;
        }
        // Parse the separator.
        index=skipWhiteSpace(index);
        if(index==msg.length()) {
            setParseError(parseError, start);  // Bad choice pattern syntax.
            errorCode=U_PATTERN_SYNTAX_ERROR;
            return 0;
        }
        UChar c=msg.charAt(index);
        if(!(c==u_pound || c==u_lessThan || c==u_lessOrEqual)) {  // U+2264 is <=
            setParseError(parseError, start);  // Expected choice separator (#<\u2264) instead of c.
            errorCode=U_PATTERN_SYNTAX_ERROR;
            return 0;
        }
        addPart(UMSGPAT_PART_TYPE_ARG_SELECTOR, index, 1, 0, errorCode);
        // Parse the message fragment.
        index=parseMessage(++index, 0, nestingLevel+1, UMSGPAT_ARG_TYPE_CHOICE, parseError, errorCode);
        if(U_FAILURE(errorCode)) {
            return 0;
        }
        // parseMessage(..., CHOICE) returns the index of the terminator, or msg.length().
        if(index==msg.length()) {
            return index;
        }
        if(msg.charAt(index)==u_rightCurlyBrace) {
            if(!inMessageFormatPattern(nestingLevel)) {
                setParseError(parseError, start);  // Bad choice pattern syntax.
                errorCode=U_PATTERN_SYNTAX_ERROR;
                return 0;
            }
            return index;
        }  // else the terminator is '|'
        index=skipWhiteSpace(index+1);
    }
}